

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

double mjs::to_integer(value *v)

{
  double dVar1;
  double dVar2;
  
  dVar1 = to_number(v);
  if (NAN(dVar1)) {
    dVar1 = 0.0;
  }
  else if (ABS(dVar1) != 0.0 && ABS(dVar1) != INFINITY) {
    dVar2 = floor(ABS(dVar1));
    dVar1 = (double)(-(ulong)(dVar1 < 0.0) & (ulong)-dVar2 | ~-(ulong)(dVar1 < 0.0) & (ulong)dVar2);
  }
  return dVar1;
}

Assistant:

double to_integer(const value& v) {
    return to_integer(to_number(v));
}